

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

char * __thiscall spirv_cross::CompilerGLSL::format_to_glsl(CompilerGLSL *this,ImageFormat format)

{
  bool bVar1;
  CompilerError *this_00;
  ImageFormat format_local;
  CompilerGLSL *this_local;
  
  if ((((this->options).es & 1U) != 0) && (bVar1 = Compiler::is_desktop_only_format(format), bVar1))
  {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"Attempting to use image format not supported in ES profile.");
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  switch(format) {
  default:
    this_local = (CompilerGLSL *)0x0;
    break;
  case ImageFormatRgba32f:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e765;
    break;
  case ImageFormatRgba16f:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e771;
    break;
  case ImageFormatR32f:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e77d;
    break;
  case ImageFormatRgba8:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e789;
    break;
  case ImageFormatRgba8Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e795;
    break;
  case ImageFormatRg32f:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e7a1;
    break;
  case ImageFormatRg16f:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e7ad;
    break;
  case ImageFormatR11fG11fB10f:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e849;
    break;
  case ImageFormatR16f:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e855;
    break;
  case ImageFormatRgba16:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e89d;
    break;
  case ImageFormatRgb10A2:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e861;
    break;
  case ImageFormatRg16:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e891;
    break;
  case ImageFormatRg8:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e879;
    break;
  case ImageFormatR16:
    this_local = (CompilerGLSL *)0x64e96e;
    break;
  case ImageFormatR8:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e86d;
    break;
  case ImageFormatRgba16Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e8c1;
    break;
  case ImageFormatRg16Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e8b5;
    break;
  case ImageFormatRg8Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e8d9;
    break;
  case ImageFormatR16Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e8a9;
    break;
  case ImageFormatR8Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e8cd;
    break;
  case ImageFormatRgba32i:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e7b9;
    break;
  case ImageFormatRgba16i:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e7c5;
    break;
  case ImageFormatRgba8i:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e7dd;
    break;
  case ImageFormatR32i:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e7d1;
    break;
  case ImageFormatRg32i:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e7e9;
    break;
  case ImageFormatRg16i:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e7f5;
    break;
  case ImageFormatRg8i:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e921;
    break;
  case ImageFormatR16i:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e92d;
    break;
  case ImageFormatR8i:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e915;
    break;
  case ImageFormatRgba32ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e801;
    break;
  case ImageFormatRgba16ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e80d;
    break;
  case ImageFormatRgba8ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e825;
    break;
  case ImageFormatR32ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e819;
    break;
  case ImageFormatRgb10a2ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e909;
    break;
  case ImageFormatRg32ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e831;
    break;
  case ImageFormatRg16ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e83d;
    break;
  case ImageFormatRg8ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e8f1;
    break;
  case ImageFormatR16ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e8fd;
    break;
  case ImageFormatR8ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e8e5;
    break;
  case ImageFormatR64ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e945;
    break;
  case ImageFormatR64i:
    this_local = (CompilerGLSL *)anon_var_dwarf_77e939;
  }
  return (char *)this_local;
}

Assistant:

const char *CompilerGLSL::format_to_glsl(spv::ImageFormat format)
{
	if (options.es && is_desktop_only_format(format))
		SPIRV_CROSS_THROW("Attempting to use image format not supported in ES profile.");

	switch (format)
	{
	case ImageFormatRgba32f:
		return "rgba32f";
	case ImageFormatRgba16f:
		return "rgba16f";
	case ImageFormatR32f:
		return "r32f";
	case ImageFormatRgba8:
		return "rgba8";
	case ImageFormatRgba8Snorm:
		return "rgba8_snorm";
	case ImageFormatRg32f:
		return "rg32f";
	case ImageFormatRg16f:
		return "rg16f";
	case ImageFormatRgba32i:
		return "rgba32i";
	case ImageFormatRgba16i:
		return "rgba16i";
	case ImageFormatR32i:
		return "r32i";
	case ImageFormatRgba8i:
		return "rgba8i";
	case ImageFormatRg32i:
		return "rg32i";
	case ImageFormatRg16i:
		return "rg16i";
	case ImageFormatRgba32ui:
		return "rgba32ui";
	case ImageFormatRgba16ui:
		return "rgba16ui";
	case ImageFormatR32ui:
		return "r32ui";
	case ImageFormatRgba8ui:
		return "rgba8ui";
	case ImageFormatRg32ui:
		return "rg32ui";
	case ImageFormatRg16ui:
		return "rg16ui";
	case ImageFormatR11fG11fB10f:
		return "r11f_g11f_b10f";
	case ImageFormatR16f:
		return "r16f";
	case ImageFormatRgb10A2:
		return "rgb10_a2";
	case ImageFormatR8:
		return "r8";
	case ImageFormatRg8:
		return "rg8";
	case ImageFormatR16:
		return "r16";
	case ImageFormatRg16:
		return "rg16";
	case ImageFormatRgba16:
		return "rgba16";
	case ImageFormatR16Snorm:
		return "r16_snorm";
	case ImageFormatRg16Snorm:
		return "rg16_snorm";
	case ImageFormatRgba16Snorm:
		return "rgba16_snorm";
	case ImageFormatR8Snorm:
		return "r8_snorm";
	case ImageFormatRg8Snorm:
		return "rg8_snorm";
	case ImageFormatR8ui:
		return "r8ui";
	case ImageFormatRg8ui:
		return "rg8ui";
	case ImageFormatR16ui:
		return "r16ui";
	case ImageFormatRgb10a2ui:
		return "rgb10_a2ui";
	case ImageFormatR8i:
		return "r8i";
	case ImageFormatRg8i:
		return "rg8i";
	case ImageFormatR16i:
		return "r16i";
	case ImageFormatR64i:
		return "r64i";
	case ImageFormatR64ui:
		return "r64ui";
	default:
	case ImageFormatUnknown:
		return nullptr;
	}
}